

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAV.h
# Opt level: O1

double __thiscall
QAV<MonahanPOMDPPlanner>::GetQ(QAV<MonahanPOMDPPlanner> *this,Index jaohI,Index jaI)

{
  long lVar1;
  Index t;
  PlanningUnitMADPDiscrete *pPVar2;
  JointBeliefInterface *b;
  double dVar3;
  
  lVar1 = *(long *)((long)(this->super_QFunctionJointBelief).super_QFunctionJointBeliefInterface +
                   -0x88);
  pPVar2 = (PlanningUnitMADPDiscrete *)
           (**(code **)(*(long *)(&(this->super_QFunctionJointBelief).
                                   super_QFunctionJointBeliefInterface.field_0x0 + lVar1) + 0x60))
                     (&(this->super_QFunctionJointBelief).super_QFunctionJointBeliefInterface.
                       field_0x0 + lVar1);
  t = PlanningUnitMADPDiscrete::GetTimeStepForJAOHI(pPVar2,(ulong)jaohI);
  lVar1 = *(long *)((long)(this->super_QFunctionJointBelief).super_QFunctionJointBeliefInterface +
                   -0x88);
  pPVar2 = (PlanningUnitMADPDiscrete *)
           (**(code **)(*(long *)(&(this->super_QFunctionJointBelief).
                                   super_QFunctionJointBeliefInterface.field_0x0 + lVar1) + 0x60))
                     (&(this->super_QFunctionJointBelief).super_QFunctionJointBeliefInterface.
                       field_0x0 + lVar1);
  b = PlanningUnitMADPDiscrete::GetJointBeliefInterface(pPVar2,(ulong)jaohI);
  dVar3 = MonahanPlanner::GetQ
                    (*(MonahanPlanner **)&(this->super_QFunctionJointBelief).field_0x8,b,t,jaI);
  (**(code **)((long)*b + 8))(b);
  return dVar3;
}

Assistant:

double GetQ(Index jaohI, Index jaI) const
        {
            Index t = GetPU()->GetTimeStepForJAOHI(jaohI);
            //Index t = GetPU()->GetJointActionObservationHistoryTree(jaohI)->
            //GetJointActionObservationHistory()->GetLength();
            JointBeliefInterface * jb = GetPU()->GetJointBeliefInterface(jaohI);
            double q = _m_p->GetQ (*jb, t, jaI);
            delete jb;
            return( q );
        }